

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O1

void ascon_hash_final(ascon_hash_ctx_t *ctx,uint8_t *digest)

{
  hash_final(ascon_permutation_12,ctx,digest,0x20);
  return;
}

Assistant:

static void
hash_final(permutation_fptr permutation,
           ascon_hash_ctx_t* const ctx,
           uint8_t* digest,
           size_t digest_len)
{
    // If there is any remaining less-than-a-block data to be absorbed
    // cached in the buffer, pad it and absorb it.
    ctx->sponge.x0 ^= bigendian_decode_varlen(ctx->buffer, ctx->buffer_len);
    ctx->sponge.x0 ^= PADDING(ctx->buffer_len);
    ascon_permutation_12(&ctx->sponge);
    // Squeeze the digest from the inner state.
    while (digest_len > ASCON_RATE)
    {
        bigendian_encode_u64(digest, ctx->sponge.x0);
        permutation(&ctx->sponge);
        digest_len -= ASCON_RATE;
        digest += ASCON_RATE;
    }
    bigendian_encode_varlen(digest, ctx->sponge.x0, (uint_fast8_t) digest_len);
    // Final security cleanup of the internal state and buffer.
    ascon_hash_cleanup(ctx);
}